

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber_decoder.c
# Opt level: O0

asn_dec_rval_t
ber_check_tags(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,asn_struct_ctx_t *opt_ctx,
              void *ptr,size_t size,int tag_mode,int last_tag_form,ber_tlv_len_t *last_length,
              int *opt_tlv_form)

{
  size_t sVar1;
  byte *pbVar2;
  undefined2 uVar3;
  int iVar4;
  long lVar5;
  ssize_t sVar6;
  char *pcVar7;
  byte *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  size_t in_R8;
  uint in_R9D;
  asn_dec_rval_t aVar8;
  uint in_stack_00000008;
  long *in_stack_00000010;
  uint *in_stack_00000018;
  size_t num_2;
  size_t num_1;
  size_t num;
  int tagno;
  int step;
  int tlv_constr;
  int expect_00_terminators;
  ber_tlv_len_t limit_len;
  ber_tlv_len_t tlv_len;
  ber_tlv_tag_t tlv_tag;
  ssize_t len_len;
  ssize_t tag_len;
  ssize_t consumed_myself;
  asn_dec_rval_t rval;
  asn_codec_ctx_t *in_stack_ffffffffffffff18;
  uint local_9c;
  uint local_80;
  uint local_7c;
  uint local_78;
  int local_74;
  size_t local_70;
  long local_68;
  ber_tlv_tag_t local_5c;
  long local_58;
  long local_50;
  size_t local_48;
  uint local_3c;
  size_t local_38;
  byte *local_30;
  long local_28;
  undefined8 *local_20;
  uint local_10;
  size_t local_8;
  
  local_48 = 0;
  local_70 = 0xffffffffffffffff;
  local_74 = 0;
  local_78 = 0xffffffff;
  if (in_RDX == 0) {
    local_9c = 0;
  }
  else {
    local_9c = (uint)*(short *)(in_RDX + 2);
  }
  local_7c = local_9c;
  local_3c = in_R9D;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  iVar4 = ASN__STACK_OVERFLOW_CHECK(in_stack_ffffffffffffff18);
  uVar3 = (undefined2)local_9c;
  if (iVar4 != 0) {
    local_10 = 2;
    if (local_28 == 0) {
      local_8 = 0;
    }
    else {
      *(undefined2 *)(local_28 + 2) = uVar3;
      local_8 = local_48;
    }
    goto LAB_0016aa3f;
  }
  iVar4 = 0;
  if (local_3c == 1) {
    iVar4 = -1;
  }
  local_80 = local_9c + iVar4;
  ASN_DEBUG("ber_check_tags(%s, size=%ld, tm=%d, step=%d, tagno=%d)",*local_20,local_38,
            (ulong)local_3c,(ulong)local_9c,(ulong)local_80);
  if ((local_3c == 0) && (local_80 == *(uint *)(local_20 + 0xd))) {
    local_50 = ber_fetch_tag(local_30,local_38,&local_5c);
    if (local_50 == -1) {
      local_10 = 2;
      if (local_28 == 0) {
        local_8 = 0;
      }
      else {
        *(undefined2 *)(local_28 + 2) = uVar3;
        local_8 = local_48;
      }
      goto LAB_0016aa3f;
    }
    if (local_50 == 0) {
      local_10 = 1;
      if (local_28 == 0) {
        local_8 = 0;
      }
      else {
        *(undefined2 *)(local_28 + 2) = uVar3;
        local_8 = local_48;
      }
      goto LAB_0016aa3f;
    }
    local_78 = (*local_30 & 0x20) >> 5;
    local_58 = ber_fetch_length(local_78,local_30 + local_50,local_38 - local_50,&local_68);
    if (local_58 == -1) {
      local_10 = 2;
      if (local_28 == 0) {
        local_8 = 0;
      }
      else {
        *(undefined2 *)(local_28 + 2) = uVar3;
        local_8 = local_48;
      }
      goto LAB_0016aa3f;
    }
    if (local_58 == 0) {
      local_10 = 1;
      if (local_28 == 0) {
        local_8 = 0;
      }
      else {
        *(undefined2 *)(local_28 + 2) = uVar3;
        local_8 = local_48;
      }
      goto LAB_0016aa3f;
    }
    ASN_DEBUG("Advancing %ld in ANY case",local_50 + local_58);
    lVar5 = local_50 + local_58;
    local_30 = local_30 + lVar5;
    local_38 = local_38 - lVar5;
    local_48 = lVar5 + local_48;
  }
  for (; uVar3 = (undefined2)local_7c, (int)local_80 < *(int *)(local_20 + 0xd);
      local_80 = local_80 + 1) {
    sVar6 = ber_fetch_tag(local_30,local_38,&local_5c);
    pbVar2 = local_30;
    sVar1 = local_38;
    local_50 = sVar6;
    pcVar7 = ber_tlv_tag_string(0);
    ASN_DEBUG("Fetching tag from {%p,%ld}: len %ld, step %d, tagno %d got %s",pbVar2,sVar1,sVar6,
              (ulong)local_7c,(ulong)local_80,pcVar7);
    if (local_50 == -1) {
      local_10 = 2;
      if (local_28 == 0) {
        local_8 = 0;
      }
      else {
        *(undefined2 *)(local_28 + 2) = uVar3;
        local_8 = local_48;
      }
      goto LAB_0016aa3f;
    }
    if (local_50 == 0) {
      local_10 = 1;
      if (local_28 == 0) {
        local_8 = 0;
      }
      else {
        *(undefined2 *)(local_28 + 2) = uVar3;
        local_8 = local_48;
      }
      goto LAB_0016aa3f;
    }
    local_78 = (uint)((*local_30 & 0x20) != 0);
    if (((local_3c == 0) || (local_7c != 0)) &&
       (local_5c != *(ber_tlv_tag_t *)(local_20[0xc] + (long)(int)local_80 * 4))) {
      pcVar7 = ber_tlv_tag_string(0);
      ASN_DEBUG("Expected: %s, expectation failed (tn=%d, tm=%d)",pcVar7,(ulong)local_80,
                (ulong)local_3c);
      local_10 = 2;
      if (local_28 == 0) {
        local_8 = 0;
      }
      else {
        *(undefined2 *)(local_28 + 2) = uVar3;
        local_8 = local_48;
      }
      goto LAB_0016aa3f;
    }
    if ((int)local_80 < *(int *)(local_20 + 0xd) + -1) {
      if (local_78 == 0) {
        ASN_DEBUG("tlv_constr = %d, expfail",0);
        local_10 = 2;
        if (local_28 == 0) {
          local_8 = 0;
        }
        else {
          *(undefined2 *)(local_28 + 2) = uVar3;
          local_8 = local_48;
        }
        goto LAB_0016aa3f;
      }
    }
    else if ((in_stack_00000008 != local_78) && (in_stack_00000008 != 0xffffffff)) {
      ASN_DEBUG("last_tag_form %d != %d",(ulong)in_stack_00000008,(ulong)local_78);
      local_10 = 2;
      if (local_28 == 0) {
        local_8 = 0;
      }
      else {
        *(undefined2 *)(local_28 + 2) = uVar3;
        local_8 = local_48;
      }
      goto LAB_0016aa3f;
    }
    local_58 = ber_fetch_length(local_78,local_30 + local_50,local_38 - local_50,&local_68);
    ASN_DEBUG("Fetching len = %ld",local_58);
    if (local_58 == -1) {
      local_10 = 2;
      if (local_28 == 0) {
        local_8 = 0;
      }
      else {
        *(undefined2 *)(local_28 + 2) = uVar3;
        local_8 = local_48;
      }
      goto LAB_0016aa3f;
    }
    if (local_58 == 0) {
      local_10 = 1;
      if (local_28 == 0) {
        local_8 = 0;
      }
      else {
        *(undefined2 *)(local_28 + 2) = uVar3;
        local_8 = local_48;
      }
      goto LAB_0016aa3f;
    }
    if (local_68 == -1) {
      if (local_70 != 0xffffffffffffffff) {
        ASN_DEBUG("Unexpected indefinite length in a chain of definite lengths");
        local_10 = 2;
        if (local_28 == 0) {
          local_8 = 0;
        }
        else {
          *(undefined2 *)(local_28 + 2) = uVar3;
          local_8 = local_48;
        }
        goto LAB_0016aa3f;
      }
      local_74 = local_74 + 1;
      local_38 = local_38 - (local_50 + local_58);
    }
    else {
      if (local_74 != 0) {
        ASN_DEBUG("Unexpected definite length in a chain of indefinite lengths");
        local_10 = 2;
        if (local_28 == 0) {
          local_8 = 0;
        }
        else {
          *(undefined2 *)(local_28 + 2) = uVar3;
          local_8 = local_48;
        }
        goto LAB_0016aa3f;
      }
      if (local_70 == 0xffffffffffffffff) {
        local_70 = local_68 + local_50 + local_58;
        if ((long)local_70 < 0) {
          local_10 = 2;
          if (local_28 == 0) {
            local_8 = 0;
          }
          else {
            *(undefined2 *)(local_28 + 2) = uVar3;
            local_8 = local_48;
          }
          goto LAB_0016aa3f;
        }
      }
      else if (local_70 != local_68 + local_50 + local_58) {
        ASN_DEBUG("Outer TLV is %ld and inner is %ld",local_70,local_68);
        local_10 = 2;
        if (local_28 == 0) {
          local_8 = 0;
        }
        else {
          *(undefined2 *)(local_28 + 2) = uVar3;
          local_8 = local_48;
        }
        goto LAB_0016aa3f;
      }
      local_38 = local_38 - (local_50 + local_58);
      local_70 = local_70 - (local_50 + local_58);
      if ((long)local_70 < (long)local_38) {
        local_38 = local_70;
      }
    }
    local_30 = local_30 + local_50 + local_58;
    local_48 = local_50 + local_58 + local_48;
    local_7c = local_7c + 1;
  }
  if (in_stack_00000018 != (uint *)0x0) {
    *in_stack_00000018 = local_78;
  }
  if (local_74 == 0) {
    *in_stack_00000010 = local_68;
  }
  else {
    *in_stack_00000010 = (long)-local_74;
  }
  local_10 = 0;
  if (local_28 != 0) {
    *(undefined2 *)(local_28 + 2) = uVar3;
  }
  local_8 = local_48;
LAB_0016aa3f:
  aVar8._4_4_ = 0;
  aVar8.code = local_10;
  aVar8.consumed = local_8;
  return aVar8;
}

Assistant:

asn_dec_rval_t
ber_check_tags(asn_codec_ctx_t *opt_codec_ctx,
		asn_TYPE_descriptor_t *td, asn_struct_ctx_t *opt_ctx,
		const void *ptr, size_t size, int tag_mode, int last_tag_form,
		ber_tlv_len_t *last_length, int *opt_tlv_form) {
	ssize_t consumed_myself = 0;
	ssize_t tag_len;
	ssize_t len_len;
	ber_tlv_tag_t tlv_tag;
	ber_tlv_len_t tlv_len;
	ber_tlv_len_t limit_len = -1;
	int expect_00_terminators = 0;
	int tlv_constr = -1;	/* If CHOICE, opt_tlv_form is not given */
	int step = opt_ctx ? opt_ctx->step : 0;	/* Where we left previously */
	int tagno;

	/*
	 * Make sure we didn't exceed the maximum stack size.
	 */
	if(ASN__STACK_OVERFLOW_CHECK(opt_codec_ctx))
		RETURN(RC_FAIL);

	/*
	 * So what does all this implicit skip stuff mean?
	 * Imagine two types,
	 * 	A ::= [5] IMPLICIT	T
	 * 	B ::= [2] EXPLICIT	T
	 * Where T is defined as
	 *	T ::= [4] IMPLICIT SEQUENCE { ... }
	 * 
	 * Let's say, we are starting to decode type A, given the
	 * following TLV stream: <5> <0>. What does this mean?
	 * It means that the type A contains type T which is,
	 * in turn, empty.
	 * Remember though, that we are still in A. We cannot
	 * just pass control to the type T decoder. Why? Because
	 * the type T decoder expects <4> <0>, not <5> <0>.
	 * So, we must make sure we are going to receive <5> while
	 * still in A, then pass control to the T decoder, indicating
	 * that the tag <4> was implicitly skipped. The decoder of T
	 * hence will be prepared to treat <4> as valid tag, and decode
	 * it appropriately.
	 */

	tagno = step	/* Continuing where left previously */
		+ (tag_mode==1?-1:0)
		;
	ASN_DEBUG("ber_check_tags(%s, size=%ld, tm=%d, step=%d, tagno=%d)",
		td->name, (long)size, tag_mode, step, tagno);
	/* assert(td->tags_count >= 1) May not be the case for CHOICE or ANY */

	if(tag_mode == 0 && tagno == td->tags_count) {
		/*
		 * This must be the _untagged_ ANY type,
		 * which outermost tag isn't known in advance.
		 * Fetch the tag and length separately.
		 */
		tag_len = ber_fetch_tag(ptr, size, &tlv_tag);
		switch(tag_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}
		tlv_constr = BER_TLV_CONSTRUCTED(ptr);
		len_len = ber_fetch_length(tlv_constr,
			(const char *)ptr + tag_len, size - tag_len, &tlv_len);
		switch(len_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}
		ASN_DEBUG("Advancing %ld in ANY case",
			(long)(tag_len + len_len));
		ADVANCE(tag_len + len_len);
	} else {
		assert(tagno < td->tags_count);	/* At least one loop */
	}
	for((void)tagno; tagno < td->tags_count; tagno++, step++) {

		/*
		 * Fetch and process T from TLV.
		 */
		tag_len = ber_fetch_tag(ptr, size, &tlv_tag);
			ASN_DEBUG("Fetching tag from {%p,%ld}: "
				"len %ld, step %d, tagno %d got %s",
				ptr, (long)size,
				(long)tag_len, step, tagno,
				ber_tlv_tag_string(tlv_tag));
		switch(tag_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}

		tlv_constr = BER_TLV_CONSTRUCTED(ptr);

		/*
		 * If {I}, don't check anything.
		 * If {I,B,C}, check B and C unless we're at I.
		 */
		if(tag_mode != 0 && step == 0) {
			/*
			 * We don't expect tag to match here.
			 * It's just because we don't know how the tag
			 * is supposed to look like.
			 */
		} else {
		    assert(tagno >= 0);	/* Guaranteed by the code above */
		    if(tlv_tag != td->tags[tagno]) {
			/*
			 * Unexpected tag. Too bad.
			 */
		    	ASN_DEBUG("Expected: %s, "
				"expectation failed (tn=%d, tm=%d)",
				ber_tlv_tag_string(td->tags[tagno]),
				tagno, tag_mode
			);
			RETURN(RC_FAIL);
		    }
		}

		/*
		 * Attention: if there are more tags expected,
		 * ensure that the current tag is presented
		 * in constructed form (it contains other tags!).
		 * If this one is the last one, check that the tag form
		 * matches the one given in descriptor.
		 */
		if(tagno < (td->tags_count - 1)) {
			if(tlv_constr == 0) {
				ASN_DEBUG("tlv_constr = %d, expfail",
					tlv_constr);
				RETURN(RC_FAIL);
			}
		} else {
			if(last_tag_form != tlv_constr
			&& last_tag_form != -1) {
				ASN_DEBUG("last_tag_form %d != %d",
					last_tag_form, tlv_constr);
				RETURN(RC_FAIL);
			}
		}

		/*
		 * Fetch and process L from TLV.
		 */
		len_len = ber_fetch_length(tlv_constr,
			(const char *)ptr + tag_len, size - tag_len, &tlv_len);
		ASN_DEBUG("Fetching len = %ld", (long)len_len);
		switch(len_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}

		/*
		 * FIXME
		 * As of today, the chain of tags
		 * must either contain several indefinite length TLVs,
		 * or several definite length ones.
		 * No mixing is allowed.
		 */
		if(tlv_len == -1) {
			/*
			 * Indefinite length.
			 */
			if(limit_len == -1) {
				expect_00_terminators++;
			} else {
				ASN_DEBUG("Unexpected indefinite length "
					"in a chain of definite lengths");
				RETURN(RC_FAIL);
			}
			ADVANCE(tag_len + len_len);
			continue;
		} else {
			if(expect_00_terminators) {
				ASN_DEBUG("Unexpected definite length "
					"in a chain of indefinite lengths");
				RETURN(RC_FAIL);
			}
		}

		/*
		 * Check that multiple TLVs specify ever decreasing length,
		 * which is consistent.
		 */
		if(limit_len == -1) {
			limit_len    = tlv_len + tag_len + len_len;
			if(limit_len < 0) {
				/* Too great tlv_len value? */
				RETURN(RC_FAIL);
			}
		} else if(limit_len != tlv_len + tag_len + len_len) {
			/*
			 * Inner TLV specifies length which is inconsistent
			 * with the outer TLV's length value.
			 */
			ASN_DEBUG("Outer TLV is %ld and inner is %ld",
				(long)limit_len, (long)tlv_len);
			RETURN(RC_FAIL);
		}

		ADVANCE(tag_len + len_len);

		limit_len -= (tag_len + len_len);
		if((ssize_t)size > limit_len) {
			/*
			 * Make sure that we won't consume more bytes
			 * from the parent frame than the inferred limit.
			 */
			size = limit_len;
		}
	}

	if(opt_tlv_form)
		*opt_tlv_form = tlv_constr;
	if(expect_00_terminators)
		*last_length = -expect_00_terminators;
	else
		*last_length = tlv_len;

	RETURN(RC_OK);
}